

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O1

cx_string<24UL> * __thiscall
mserialize::cx_strcat<6ul,2ul,11ul,3ul,1ul,1ul>
          (cx_string<24UL> *__return_storage_ptr__,mserialize *this,cx_string<6UL> *strings,
          cx_string<2UL> *strings_1,cx_string<11UL> *strings_2,cx_string<3UL> *strings_3,
          cx_string<1UL> *strings_4,cx_string<1UL> *strings_5)

{
  long lVar1;
  ulong uVar2;
  char **ppcVar3;
  ulong local_a8 [5];
  size_t size [7];
  char *data [7];
  
  ppcVar3 = data + 3;
  data[5]._0_1_ = 0;
  data[5]._1_7_ = 0;
  data[3] = (char *)0x0;
  data[4]._0_1_ = 0;
  data[4]._1_7_ = 0;
  size[4] = (size_t)this;
  size[5] = (size_t)strings;
  size[6] = (size_t)strings_1;
  data[0] = strings_3->_data;
  data[1] = strings_4->_data;
  local_a8[1] = 6;
  local_a8[2] = 2;
  local_a8[3] = 0xb;
  local_a8[4] = 3;
  lVar1 = 1;
  size[0] = 1;
  size[1] = 1;
  do {
    if (local_a8[lVar1] != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)ppcVar3 + uVar2) = *(undefined1 *)(size[lVar1 + 3] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < local_a8[lVar1]);
      ppcVar3 = (char **)((long)ppcVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  __return_storage_ptr__->_data[0x18] = '\0';
  *(char **)__return_storage_ptr__->_data = data[3];
  *(ulong *)(__return_storage_ptr__->_data + 8) = CONCAT71(data[4]._1_7_,data[4]._0_1_);
  *(ulong *)(__return_storage_ptr__->_data + 0x10) = CONCAT71(data[5]._1_7_,data[5]._0_1_);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}